

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arranger.cpp
# Opt level: O0

void message_loop(string *filename,string *download_address,curl_off_t file_length,
                 download_status *status)

{
  bool bVar1;
  reference ppTVar2;
  iterator __first;
  _List_iterator<Task_*> task_i;
  curl_off_t cVar3;
  reference ppTVar4;
  reference ppTVar5;
  Task *this;
  size_type sVar6;
  size_type sVar7;
  int local_f0;
  proxy local_e8;
  Task *local_b8;
  Task *task_to_append;
  curl_off_t new_block_length;
  _List_node_base *local_a0;
  _Self local_98;
  _Self local_90;
  iterator new_task;
  undefined1 local_78 [8];
  proxy current_proxy;
  value_type local_30;
  Task *task_reported;
  download_status *status_local;
  curl_off_t file_length_local;
  string *download_address_local;
  string *filename_local;
  
  task_reported = (Task *)status;
  status_local = (download_status *)file_length;
  file_length_local = (curl_off_t)download_address;
  download_address_local = filename;
  do {
    bVar1 = std::queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_>::empty
                      ((queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_> *)task_reported)
    ;
    if (!bVar1) {
      pthread_mutex_lock((pthread_mutex_t *)&tpListLock);
      pthread_mutex_lock((pthread_mutex_t *)&messageLock);
      ppTVar2 = std::queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_>::front
                          ((queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_> *)
                           task_reported);
      local_30 = *ppTVar2;
      std::queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_>::pop
                ((queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_> *)task_reported);
      pthread_mutex_unlock((pthread_mutex_t *)&messageLock);
      if (local_30->status == 3) {
        std::__cxx11::list<proxy,_std::allocator<proxy>_>::remove
                  ((list<proxy,_std::allocator<proxy>_> *)(task_reported + 1),
                   (char *)&local_30->proxy_server);
        bVar1 = std::__cxx11::list<proxy,_std::allocator<proxy>_>::empty
                          ((list<proxy,_std::allocator<proxy>_> *)(task_reported + 1));
        if (bVar1) {
          fputs("no proxy to use.",_stderr);
          exit(-1);
        }
        __first = std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::begin
                            ((list<Task_*,_std::allocator<Task_*>_> *)&task_reported->status);
        current_proxy.speed =
             (curl_off_t)
             std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::end
                       ((list<Task_*,_std::allocator<Task_*>_> *)&task_reported->status);
        task_i = std::find<std::_List_iterator<Task*>,Task*>
                           (__first._M_node,(_List_iterator<Task_*>)current_proxy.speed,&local_30);
        cover_or_trim_task((iterator)task_i._M_node,download_address_local,
                           (string *)file_length_local,(download_status *)task_reported);
      }
      else {
        proxy::proxy((proxy *)local_78,&local_30->proxy_server);
        cVar3 = Task::length(local_30);
        if (0x300000 < cVar3) {
          current_proxy._32_8_ = local_30->speed;
        }
        local_90._M_node =
             (_List_node_base *)
             std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::begin
                       ((list<Task_*,_std::allocator<Task_*>_> *)&task_reported->status);
        while( true ) {
          local_98._M_node =
               (_List_node_base *)
               std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::end
                         ((list<Task_*,_std::allocator<Task_*>_> *)&task_reported->status);
          bVar1 = std::operator!=(&local_90,&local_98);
          if (!bVar1) break;
          ppTVar4 = std::_List_iterator<Task_*>::operator*(&local_90);
          if ((*ppTVar4)->status == 3) {
            std::queue<proxy,_std::deque<proxy,_std::allocator<proxy>_>_>::push
                      ((queue<proxy,_std::deque<proxy,_std::allocator<proxy>_>_> *)
                       &task_reported[1].proxy_server.field_0x10,(value_type *)local_78);
            local_a0 = local_90._M_node;
            cover_or_trim_task((iterator)local_90._M_node,download_address_local,
                               (string *)file_length_local,(download_status *)task_reported);
            local_f0 = 4;
            goto LAB_00107341;
          }
          new_block_length = (curl_off_t)std::_List_iterator<Task_*>::operator++(&local_90,0);
        }
        task_to_append = (Task *)(current_proxy._32_8_ * 0x14);
        ppTVar5 = std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::back
                            ((list<Task_*,_std::allocator<Task_*>_> *)&task_reported->status);
        if ((*ppTVar5)->end < (long)status_local) {
          this = (Task *)operator_new(0x68);
          proxy::proxy(&local_e8,&local_30->proxy_server);
          ppTVar5 = std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::back
                              ((list<Task_*,_std::allocator<Task_*>_> *)&task_reported->status);
          Task::Task(this,&local_e8,(*ppTVar5)->end,0);
          proxy::~proxy(&local_e8);
          local_b8 = this;
          ppTVar5 = std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::back
                              ((list<Task_*,_std::allocator<Task_*>_> *)&task_reported->status);
          if ((long)&task_to_append->task_id + (*ppTVar5)->end < (long)status_local) {
            ppTVar5 = std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::back
                                ((list<Task_*,_std::allocator<Task_*>_> *)&task_reported->status);
            local_b8->end = (long)&task_to_append->task_id + (*ppTVar5)->end;
          }
          else {
            local_b8->end = (curl_off_t)status_local;
          }
          std::__cxx11::list<Task_*,_std::allocator<Task_*>_>::push_back
                    ((list<Task_*,_std::allocator<Task_*>_> *)&task_reported->status,&local_b8);
          Task::execute(local_b8,download_address_local,(string *)file_length_local,
                        (queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_> *)task_reported
                       );
          local_f0 = 4;
        }
        else {
          std::queue<proxy,_std::deque<proxy,_std::allocator<proxy>_>_>::push
                    ((queue<proxy,_std::deque<proxy,_std::allocator<proxy>_>_> *)
                     &task_reported[1].proxy_server.field_0x10,(value_type *)local_78);
          sVar6 = std::queue<proxy,_std::deque<proxy,_std::allocator<proxy>_>_>::size
                            ((queue<proxy,_std::deque<proxy,_std::allocator<proxy>_>_> *)
                             &task_reported[1].proxy_server.field_0x10);
          sVar7 = std::__cxx11::list<proxy,_std::allocator<proxy>_>::size
                            ((list<proxy,_std::allocator<proxy>_> *)(task_reported + 1));
          if (sVar6 == sVar7) {
            local_f0 = 1;
          }
          else {
            local_f0 = 4;
          }
        }
LAB_00107341:
        proxy::~proxy((proxy *)local_78);
        if (local_f0 == 1) {
          return;
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&tpListLock);
    }
    usleep(20000);
  } while( true );
}

Assistant:

void
message_loop(const string &filename, const string &download_address, curl_off_t file_length, download_status *status) {
    while (true) {
        if (!status->taskMessageQueue.empty()) {
            // 直接加锁了，不废话。
            pthread_mutex_lock(&tpListLock);
            pthread_mutex_lock(&messageLock);
            Task *task_reported = status->taskMessageQueue.front();
            status->taskMessageQueue.pop();
            pthread_mutex_unlock(&messageLock);
            if (task_reported->status == STATUS_ERROR) {
                // 下载出错，删去有问题的代理服务器，并尝试从空闲的代理中拿到新的来下载这块数据。
                status->globalProxyList.remove(task_reported->proxy_server);
                if (status->globalProxyList.empty()) {
                    fputs("no proxy to use.", stderr);
                    exit(-1);
                }
                cover_or_trim_task(find(status->globalTaskList.begin(), status->globalTaskList.end(), task_reported),
                                   filename, download_address, status);
                goto loop_end;
            } else {
                // 不是错误，就是成功了。下载成功，就重新查询列表中是否有失败的下载，如果有则要“切开”分配下载任务，在此之前，我们需要确定这个成功的代理服务器的下载速度。
                proxy current_proxy = task_reported->proxy_server;

                // 只有足够大的下载才算有效速度。
                if (task_reported->length() > MINI_DOWNLOAD_BYTES) {
                    current_proxy.speed = task_reported->speed;
                }
                // 声明当前代理闲置，切开有错误的下载或对其重新分配。
                for (auto new_task = status->globalTaskList.begin();
                     new_task != status->globalTaskList.end(); new_task++) {
                    if ((*new_task)->status == STATUS_ERROR) {
                        status->pending_proxy_servers.push(current_proxy);
                        cover_or_trim_task(new_task, filename, download_address, status);
                        goto loop_end;
                    }
                }
                // 遍历了所有任务，也找不到下载错误的任务，就分配新的任务让这个空出来的服务器下载。
                curl_off_t new_block_length = current_proxy.speed * EXPECT_DOWNLOAD_TIME_SEC;
                if (status->globalTaskList.back()->end < file_length) {
                    Task *task_to_append = new Task(task_reported->proxy_server, status->globalTaskList.back()->end, 0);
                    // 全局下载任务还没有分配到尽头，需要继续往下分配。
                    if (status->globalTaskList.back()->end + new_block_length < file_length) {
                        task_to_append->end = status->globalTaskList.back()->end + new_block_length;
                    } else {
                        // 整个下载在这个任务分配完毕后已经走到了尽头。
                        task_to_append->end = file_length;
                    }
                    status->globalTaskList.push_back(task_to_append);
                    task_to_append->execute(filename, download_address, &status->taskMessageQueue);
                    goto loop_end;
                } else {
                    // 找不到新块，就把代理服务器和下载速度放在待命区域，准备下载。
                    status->pending_proxy_servers.push(current_proxy);
                    if (status->pending_proxy_servers.size() == status->globalProxyList.size()) {
                        // 所有的服务器都已经空出来了，可以完成下载了。
                        return;
                    }
                    goto loop_end;
                }
            }
            loop_end:;
            pthread_mutex_unlock(&tpListLock);
        }
        usleep(20000);
    }
}